

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpconn.c
# Opt level: O0

int nni_posix_tcp_alloc(nni_tcp_conn **cp,nni_tcp_dialer *d,int fd)

{
  nni_tcp_conn *arg;
  nni_tcp_conn *c;
  int fd_local;
  nni_tcp_dialer *d_local;
  nni_tcp_conn **cp_local;
  
  arg = (nni_tcp_conn *)nni_zalloc(0xe8);
  if (arg == (nni_tcp_conn *)0x0) {
    cp_local._4_4_ = 2;
  }
  else {
    arg->closed = false;
    arg->dialer = d;
    nni_mtx_init(&arg->mtx);
    nni_aio_list_init(&arg->readq);
    nni_aio_list_init(&arg->writeq);
    nni_posix_pfd_init(&arg->pfd,fd,tcp_cb,arg);
    (arg->stream).s_free = tcp_free;
    (arg->stream).s_stop = tcp_stop;
    (arg->stream).s_close = tcp_close;
    (arg->stream).s_recv = tcp_recv;
    (arg->stream).s_send = tcp_send;
    (arg->stream).s_get = tcp_get;
    (arg->stream).s_set = tcp_set;
    *cp = arg;
    cp_local._4_4_ = 0;
  }
  return cp_local._4_4_;
}

Assistant:

int
nni_posix_tcp_alloc(nni_tcp_conn **cp, nni_tcp_dialer *d, int fd)
{
	nni_tcp_conn *c;
	if ((c = NNI_ALLOC_STRUCT(c)) == NULL) {
		return (NNG_ENOMEM);
	}

	c->closed = false;
	c->dialer = d;

	nni_mtx_init(&c->mtx);
	nni_aio_list_init(&c->readq);
	nni_aio_list_init(&c->writeq);
	nni_posix_pfd_init(&c->pfd, fd, tcp_cb, c);

	c->stream.s_free  = tcp_free;
	c->stream.s_stop  = tcp_stop;
	c->stream.s_close = tcp_close;
	c->stream.s_recv  = tcp_recv;
	c->stream.s_send  = tcp_send;
	c->stream.s_get   = tcp_get;
	c->stream.s_set   = tcp_set;

	*cp = c;
	return (0);
}